

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-client.c
# Opt level: O0

agent_pending_query *
agent_query(strbuf *query,void **out,int *outlen,_func_void_void_ptr_void_ptr_int *callback,
           void *callback_ctx)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  agent_pending_query *conn_00;
  int ret;
  agent_pending_query *conn;
  int done;
  sockaddr_un addr;
  int sock;
  char *name;
  void *callback_ctx_local;
  _func_void_void_ptr_void_ptr_int *callback_local;
  int *outlen_local;
  void **out_local;
  strbuf *query_local;
  
  register0x00000000 = agent_socket_path();
  if ((register0x00000000 != (char *)0x0) && (sVar3 = strlen(register0x00000000), sVar3 < 0x6c)) {
    addr.sun_path._100_4_ = socket(1,1,0);
    if ((int)addr.sun_path._100_4_ < 0) {
      perror("socket(PF_UNIX)");
      exit(1);
    }
    cloexec(addr.sun_path._100_4_);
    conn._6_2_ = 1;
    strcpy((char *)&done,stack0xffffffffffffffc0);
    iVar2 = connect(addr.sun_path._100_4_,(sockaddr *)((long)&conn + 6),0x6e);
    if (iVar2 < 0) {
      close(addr.sun_path._100_4_);
    }
    else {
      strbuf_finalise_agent_query(query);
      conn._0_4_ = 0;
      while( true ) {
        if (query->len <= (ulong)(long)(int)conn) {
          conn_00 = (agent_pending_query *)safemalloc(1,0x30,0);
          conn_00->fd = addr.sun_path._100_4_;
          conn_00->retbuf = conn_00->sizebuf;
          conn_00->retsize = 4;
          conn_00->retlen = 0;
          conn_00->callback = callback;
          conn_00->callback_ctx = callback_ctx;
          if (callback == (_func_void_void_ptr_void_ptr_int *)0x0) {
            no_nonblock(conn_00->fd);
            do {
              _Var1 = agent_try_read(conn_00);
            } while (((_Var1 ^ 0xffU) & 1) != 0);
            *out = conn_00->retbuf;
            *outlen = conn_00->retlen;
            safefree(conn_00);
            return (agent_pending_query *)0x0;
          }
          if (agent_pending_queries == (tree234 *)0x0) {
            agent_pending_queries = newtree234(agent_conncmp);
          }
          add234(agent_pending_queries,conn_00);
          uxsel_set(addr.sun_path._100_4_,1,agent_select_result);
          return conn_00;
        }
        sVar4 = write(addr.sun_path._100_4_,query->s + (int)conn,query->len - (long)(int)conn);
        if ((int)sVar4 < 1) break;
        conn._0_4_ = (int)sVar4 + (int)conn;
      }
      close(addr.sun_path._100_4_);
    }
  }
  *out = (void *)0x0;
  *outlen = 0;
  return (agent_pending_query *)0x0;
}

Assistant:

agent_pending_query *agent_query(
    strbuf *query, void **out, int *outlen,
    void (*callback)(void *, void *, int), void *callback_ctx)
{
    const char *name;
    int sock;
    struct sockaddr_un addr;
    int done;
    agent_pending_query *conn;

    name = agent_socket_path();
    if (!name || strlen(name) >= sizeof(addr.sun_path))
        goto failure;

    sock = socket(PF_UNIX, SOCK_STREAM, 0);
    if (sock < 0) {
        perror("socket(PF_UNIX)");
        exit(1);
    }

    cloexec(sock);

    addr.sun_family = AF_UNIX;
    strcpy(addr.sun_path, name);
    if (connect(sock, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
        close(sock);
        goto failure;
    }

    strbuf_finalise_agent_query(query);

    for (done = 0; done < query->len ;) {
        int ret = write(sock, query->s + done,
                        query->len - done);
        if (ret <= 0) {
            close(sock);
            goto failure;
        }
        done += ret;
    }

    conn = snew(agent_pending_query);
    conn->fd = sock;
    conn->retbuf = conn->sizebuf;
    conn->retsize = 4;
    conn->retlen = 0;
    conn->callback = callback;
    conn->callback_ctx = callback_ctx;

    if (!callback) {
        /*
         * Bodge to permit making deliberately synchronous agent
         * requests. Used by Unix Pageant in command-line client mode,
         * which is legit because it really is true that no other part
         * of the program is trying to get anything useful done
         * simultaneously. But this special case shouldn't be used in
         * any more general program.
         */
        no_nonblock(conn->fd);
        while (!agent_try_read(conn))
            /* empty loop body */;

        *out = conn->retbuf;
        *outlen = conn->retlen;
        sfree(conn);
        return NULL;
    }

    /*
     * Otherwise do it properly: add conn to the tree of agent
     * connections currently in flight, return 0 to indicate that the
     * response hasn't been received yet, and call the callback when
     * select_result comes back to us.
     */
    if (!agent_pending_queries)
        agent_pending_queries = newtree234(agent_conncmp);
    add234(agent_pending_queries, conn);

    uxsel_set(sock, SELECT_R, agent_select_result);
    return conn;

    failure:
    *out = NULL;
    *outlen = 0;
    return NULL;
}